

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnodeForceAbsolute::~ChLoadXYZnodeForceAbsolute(ChLoadXYZnodeForceAbsolute *this)

{
  (this->super_ChLoadXYZnodeForce).super_ChLoadCustom.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadXYZnodeForceAbsolute_0116d400;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_modulation).
              super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ChLoadCustom::~ChLoadCustom((ChLoadCustom *)this);
  return;
}

Assistant:

class ChApi ChLoadXYZnodeForceAbsolute : public ChLoadXYZnodeForce {
  public:
    ChLoadXYZnodeForceAbsolute(std::shared_ptr<ChNodeXYZ> node,  ///< node to apply load to
                    const ChVector<>& force        ///< force to apply, assumed in absolute coordsys,
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadXYZnodeForceAbsolute* Clone() const override { return new ChLoadXYZnodeForceAbsolute(*this); }

	/// Compute the force on the node, in absolute coordsystem,
    /// given position of node as abs_pos.
    virtual void ComputeForce(const ChVector<>& abs_pos,
									 const ChVector<>& abs_vel,
                                           ChVector<>& abs_force) override;

    /// Set the applied force vector: it is assumed constant, unless a
	/// non-constant scaling time function is provided.
    /// It is expressed in absolute coordinates. 
    void SetForceBase(const ChVector<>& force);

    /// Return the current force vector (scaled by the current modulation value).
    ChVector<> GetForce() const;

    /// Set modulation function.
    /// This is a function of time which (optionally) modulates the specified applied force.
    /// By default the modulation is a constant function, always returning a value of 1.
    void SetModulationFunction(std::shared_ptr<ChFunction> modulation) { m_modulation = modulation; }


  protected:
    ChVector<> m_force_base;  ///< base force value

	std::shared_ptr<ChFunction> m_modulation;  ///< modulation function of time
    double m_scale;                            ///< scaling factor (current modulation value)

    virtual bool IsStiff() override { return false; }

    virtual void Update(double time) override;
}